

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

ssize_t __thiscall RenX::LadderDatabase::write(LadderDatabase *this,int __fd,void *__buf,size_t __n)

{
  FILE *__stream;
  undefined4 in_register_00000034;
  Entry *local_60;
  Entry *entry;
  undefined1 local_48 [8];
  DataBuffer buffer;
  char *local_28;
  size_t rank;
  FILE *file;
  char *filename_local;
  LadderDatabase *this_local;
  
  __stream = (FILE *)this;
  if ((this->m_entries != 0) &&
     (__stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"wb"), __stream != (FILE *)0x0))
  {
    local_28 = (char *)0x0;
    Jupiter::DataBuffer::DataBuffer((DataBuffer *)local_48);
    (**(code **)(*(long *)this + 0x10))(this,__stream);
    for (local_60 = this->m_head; local_60 != (Entry *)0x0; local_60 = local_60->next) {
      local_28 = local_28 + 1;
      local_60->rank = (size_t)local_28;
      Jupiter::DataBuffer::push<unsigned_long>((DataBuffer *)local_48,&local_60->steam_id);
      Jupiter::DataBuffer::push<unsigned_long>((DataBuffer *)local_48,&local_60->total_score);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_deaths);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_headshot_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_vehicle_kills)
      ;
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_building_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_defence_kills)
      ;
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_captures);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_game_time);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_games);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_wins);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_beacon_placements);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_beacon_disarms);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_proxy_placements);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_proxy_disarms)
      ;
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_games);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_wins);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_ties);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_game_time)
      ;
      Jupiter::DataBuffer::push<unsigned_long>((DataBuffer *)local_48,&local_60->total_gdi_score);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_beacon_placements);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_beacon_disarms);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_proxy_placements);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_proxy_disarms);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_deaths);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_vehicle_kills);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_defence_kills);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_gdi_building_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_gdi_headshots)
      ;
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_games);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_wins);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_game_time)
      ;
      Jupiter::DataBuffer::push<unsigned_long>((DataBuffer *)local_48,&local_60->total_nod_score);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_beacon_placements);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_beacon_disarms);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_proxy_placements);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_proxy_disarms);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_deaths);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_vehicle_kills);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_defence_kills);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->total_nod_building_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->total_nod_headshots)
      ;
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_score);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->most_deaths);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_headshot_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_vehicle_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_building_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_defence_kills);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_captures);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_game_time);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->top_beacon_placements);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_beacon_disarms);
      Jupiter::DataBuffer::push<unsigned_int>
                ((DataBuffer *)local_48,&local_60->top_proxy_placements);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->top_proxy_disarms);
      Jupiter::DataBuffer::push<unsigned_int>((DataBuffer *)local_48,&local_60->most_recent_ip);
      Jupiter::DataBuffer::push<long>((DataBuffer *)local_48,&local_60->last_game);
      Jupiter::DataBuffer::
      push<std::__cxx11::basic_string,char,std::char_traits<char>,std::allocator<char>>
                ((DataBuffer *)local_48,&local_60->most_recent_name);
      Jupiter::DataBuffer::push_to((_IO_FILE *)local_48);
    }
    fclose(__stream);
    __stream = (FILE *)Jupiter::DataBuffer::~DataBuffer((DataBuffer *)local_48);
  }
  return (ssize_t)__stream;
}

Assistant:

void RenX::LadderDatabase::write(const char *filename) {
	if (m_entries != 0)
	{
		FILE *file = fopen(filename, "wb");
		if (file != nullptr)
		{
			size_t rank = 0;
			Jupiter::DataBuffer buffer;
			create_header(file);
			Entry *entry = m_head;
			while (entry != nullptr)
			{
				// update rank
				entry->rank = ++rank;

				// push data from entry to buffer
				buffer.push(entry->steam_id);
				buffer.push(entry->total_score);

				buffer.push(entry->total_kills);
				buffer.push(entry->total_deaths);
				buffer.push(entry->total_headshot_kills);
				buffer.push(entry->total_vehicle_kills);
				buffer.push(entry->total_building_kills);
				buffer.push(entry->total_defence_kills);
				buffer.push(entry->total_captures);
				buffer.push(entry->total_game_time);
				buffer.push(entry->total_games);
				buffer.push(entry->total_wins);
				buffer.push(entry->total_beacon_placements);
				buffer.push(entry->total_beacon_disarms);
				buffer.push(entry->total_proxy_placements);
				buffer.push(entry->total_proxy_disarms);

				buffer.push(entry->total_gdi_games);
				buffer.push(entry->total_gdi_wins);
				buffer.push(entry->total_gdi_ties);
				buffer.push(entry->total_gdi_game_time);
				buffer.push(entry->total_gdi_score);
				buffer.push(entry->total_gdi_beacon_placements);
				buffer.push(entry->total_gdi_beacon_disarms);
				buffer.push(entry->total_gdi_proxy_placements);
				buffer.push(entry->total_gdi_proxy_disarms);
				buffer.push(entry->total_gdi_kills);
				buffer.push(entry->total_gdi_deaths);
				buffer.push(entry->total_gdi_vehicle_kills);
				buffer.push(entry->total_gdi_defence_kills);
				buffer.push(entry->total_gdi_building_kills);
				buffer.push(entry->total_gdi_headshots);

				buffer.push(entry->total_nod_games);
				buffer.push(entry->total_nod_wins);
				buffer.push(entry->total_nod_game_time);
				buffer.push(entry->total_nod_score);
				buffer.push(entry->total_nod_beacon_placements);
				buffer.push(entry->total_nod_beacon_disarms);
				buffer.push(entry->total_nod_proxy_placements);
				buffer.push(entry->total_nod_proxy_disarms);
				buffer.push(entry->total_nod_kills);
				buffer.push(entry->total_nod_deaths);
				buffer.push(entry->total_nod_vehicle_kills);
				buffer.push(entry->total_nod_defence_kills);
				buffer.push(entry->total_nod_building_kills);
				buffer.push(entry->total_nod_headshots);

				buffer.push(entry->top_score);
				buffer.push(entry->top_kills);
				buffer.push(entry->most_deaths);
				buffer.push(entry->top_headshot_kills);
				buffer.push(entry->top_vehicle_kills);
				buffer.push(entry->top_building_kills);
				buffer.push(entry->top_defence_kills);
				buffer.push(entry->top_captures);
				buffer.push(entry->top_game_time);
				buffer.push(entry->top_beacon_placements);
				buffer.push(entry->top_beacon_disarms);
				buffer.push(entry->top_proxy_placements);
				buffer.push(entry->top_proxy_disarms);

				buffer.push(entry->most_recent_ip);
				buffer.push(entry->last_game);
				buffer.push(entry->most_recent_name);

				// push buffer to file
				buffer.push_to(file);

				// iterate
				entry = entry->next;
			}
			fclose(file);
		}
	}
}